

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_insertBlock(ZSTD_DCtx *dctx,void *blockStart,size_t blockSize)

{
  void *pvVar1;
  
  pvVar1 = dctx->previousDstEnd;
  if (pvVar1 != blockStart) {
    dctx->dictEnd = pvVar1;
    dctx->virtualStart = (void *)(((long)dctx->prefixStart - (long)pvVar1) + (long)blockStart);
    dctx->prefixStart = blockStart;
    dctx->previousDstEnd = blockStart;
  }
  dctx->previousDstEnd = (void *)((long)blockStart + blockSize);
  return blockSize;
}

Assistant:

size_t ZSTD_insertBlock(ZSTD_DCtx* dctx, const void* blockStart, size_t blockSize)
{
    ZSTD_checkContinuity(dctx, blockStart);
    dctx->previousDstEnd = (const char*)blockStart + blockSize;
    return blockSize;
}